

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatBuffer.h
# Opt level: O2

void __thiscall
slang::FormatBuffer::
format<std::basic_string_view<char,std::char_traits<char>>const&,std::__cxx11::string>
          (FormatBuffer *this,
          format_string<const_std::basic_string_view<char>_&,_std::__cxx11::basic_string<char>_> fmt
          ,basic_string_view<char,_std::char_traits<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  format_args args_00;
  char *local_28;
  size_t local_20;
  pointer local_18;
  size_type sStack_10;
  
  local_20 = args->_M_len;
  local_28 = args->_M_str;
  local_18 = (args_1->_M_dataplus)._M_p;
  sStack_10 = args_1->_M_string_length;
  args_00.field_1.values_ = (value<fmt::v11::context> *)&local_28;
  args_00.desc_ = 0xdd;
  ::fmt::v11::detail::vformat_to((buffer<char> *)this,fmt.str,args_00,(locale_ref)0x0);
  return;
}

Assistant:

void format(fmt::format_string<Args...> fmt, Args&&... args) {
        fmt::detail::vformat_to(buf, fmt::string_view(fmt), fmt::make_format_args(args...));
    }